

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

void __thiscall
lscpp::stdio_transporter::write_message(stdio_transporter *this,string *str,bool newline)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  string *psStack_18;
  bool newline_local;
  string *str_local;
  stdio_transporter *this_local;
  
  local_19 = newline;
  psStack_18 = str;
  str_local = (string *)this;
  if (newline) {
    std::operator+(&local_40,str,"\r\n");
    write_message_impl(this,&local_40,false);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)str);
    write_message_impl(this,&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void stdio_transporter::write_message(std::string const &str, bool newline) {
  if (newline) {
#ifdef _WIN32
    write_message_impl(str + "\n");
#else
    write_message_impl(str + "\r\n");
#endif
  } else
    write_message_impl(str, true);
}